

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

void __thiscall
slang::syntax::UdpDeclarationSyntax::setChild
          (UdpDeclarationSyntax *this,size_t index,TokenOrSyntax child)

{
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *pSVar1;
  SyntaxNode *pSVar2;
  logic_error *this_00;
  Token TVar3;
  NamedBlockClauseSyntax *local_178;
  UdpBodySyntax *local_170;
  UdpPortListSyntax *local_168;
  string local_140;
  allocator<char> local_109;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  undefined8 local_68;
  Info *local_60;
  UdpBodySyntax *local_58;
  UdpBodySyntax *local_50;
  UdpPortListSyntax *local_48;
  UdpPortListSyntax *local_40;
  undefined8 local_38;
  Info *local_30;
  undefined8 local_28;
  Info *local_20;
  size_t local_18;
  size_t index_local;
  UdpDeclarationSyntax *this_local;
  
  local_18 = index;
  index_local = (size_t)this;
  switch(index) {
  case 0:
    pSVar2 = TokenOrSyntax::node(&child);
    pSVar1 = SyntaxNode::as<slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>>
                       (pSVar2);
    SyntaxList<slang::syntax::AttributeInstanceSyntax>::operator=
              (&(this->super_MemberSyntax).attributes,pSVar1);
    break;
  case 1:
    TVar3 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    local_28 = TVar3._0_8_;
    (this->primitive).kind = (undefined2)local_28;
    (this->primitive).field_0x2 = local_28._2_1_;
    (this->primitive).numFlags = (NumericTokenFlags)local_28._3_1_;
    (this->primitive).rawLen = local_28._4_4_;
    local_20 = TVar3.info;
    (this->primitive).info = local_20;
    break;
  case 2:
    TVar3 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    local_38 = TVar3._0_8_;
    (this->name).kind = (undefined2)local_38;
    (this->name).field_0x2 = local_38._2_1_;
    (this->name).numFlags = (NumericTokenFlags)local_38._3_1_;
    (this->name).rawLen = local_38._4_4_;
    local_30 = TVar3.info;
    (this->name).info = local_30;
    break;
  case 3:
    pSVar2 = TokenOrSyntax::node(&child);
    if (pSVar2 == (SyntaxNode *)0x0) {
      local_168 = (UdpPortListSyntax *)0x0;
    }
    else {
      pSVar2 = TokenOrSyntax::node(&child);
      local_168 = SyntaxNode::as<slang::syntax::UdpPortListSyntax>(pSVar2);
    }
    local_48 = local_168;
    not_null<slang::syntax::UdpPortListSyntax*>::not_null<slang::syntax::UdpPortListSyntax*,void>
              ((not_null<slang::syntax::UdpPortListSyntax*> *)&local_40,&local_48);
    (this->portList).ptr = local_40;
    break;
  case 4:
    pSVar2 = TokenOrSyntax::node(&child);
    if (pSVar2 == (SyntaxNode *)0x0) {
      local_170 = (UdpBodySyntax *)0x0;
    }
    else {
      pSVar2 = TokenOrSyntax::node(&child);
      local_170 = SyntaxNode::as<slang::syntax::UdpBodySyntax>(pSVar2);
    }
    local_58 = local_170;
    not_null<slang::syntax::UdpBodySyntax*>::not_null<slang::syntax::UdpBodySyntax*,void>
              ((not_null<slang::syntax::UdpBodySyntax*> *)&local_50,&local_58);
    (this->body).ptr = local_50;
    break;
  case 5:
    TVar3 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    local_68 = TVar3._0_8_;
    (this->endprimitive).kind = (undefined2)local_68;
    (this->endprimitive).field_0x2 = local_68._2_1_;
    (this->endprimitive).numFlags = (NumericTokenFlags)local_68._3_1_;
    (this->endprimitive).rawLen = local_68._4_4_;
    local_60 = TVar3.info;
    (this->endprimitive).info = local_60;
    break;
  case 6:
    pSVar2 = TokenOrSyntax::node(&child);
    if (pSVar2 == (SyntaxNode *)0x0) {
      local_178 = (NamedBlockClauseSyntax *)0x0;
    }
    else {
      pSVar2 = TokenOrSyntax::node(&child);
      local_178 = SyntaxNode::as<slang::syntax::NamedBlockClauseSyntax>(pSVar2);
    }
    this->endBlockName = local_178;
    break;
  default:
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_108,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/build_O0/extern/slang/source/AllSyntax.cpp"
               ,&local_109);
    std::operator+(&local_e8,&local_108,":");
    std::__cxx11::to_string(&local_140,0x3383);
    std::operator+(&local_c8,&local_e8,&local_140);
    std::operator+(&local_a8,&local_c8,": ");
    std::operator+(&local_88,&local_a8,"Default case should be unreachable!");
    std::logic_error::logic_error(this_00,(string *)&local_88);
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  return;
}

Assistant:

void UdpDeclarationSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: attributes = child.node()->as<SyntaxList<AttributeInstanceSyntax>>(); return;
        case 1: primitive = child.token(); return;
        case 2: name = child.token(); return;
        case 3: portList = child.node() ? &child.node()->as<UdpPortListSyntax>() : nullptr; return;
        case 4: body = child.node() ? &child.node()->as<UdpBodySyntax>() : nullptr; return;
        case 5: endprimitive = child.token(); return;
        case 6: endBlockName = child.node() ? &child.node()->as<NamedBlockClauseSyntax>() : nullptr; return;
        default: ASSUME_UNREACHABLE;
    }
}